

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadLocalStorage.h
# Opt level: O0

void TLS::BASE<tls_data_t,_1024U>::_details::thread_exiting(void *value)

{
  value_type_conflict vVar1;
  bool bVar2;
  pointer this;
  reference pvVar3;
  reference pvVar4;
  ulong __n;
  lock_guard<TLS::BASE<tls_data_t,_1024U>::_details> local_20;
  lock_guard<TLS::BASE<tls_data_t,_1024U>::_details> lock;
  uint32_t index;
  void *value_local;
  
  pthread_setspecific(BASE<tls_data_t,1024u>::_details::_pthread_key,(void *)0x0);
  lock._M_device._4_4_ = (uint)value;
  std::lock_guard<TLS::BASE<tls_data_t,_1024U>::_details>::lock_guard
            (&local_20,(mutex_type *)BASE<tls_data_t,1024u>::_d);
  std::array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL>::operator[]
            ((array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL> *)
             (BASE<tls_data_t,1024u>::_d + 0x40),(ulong)lock._M_device._4_4_);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&BASE<tls_data_t,1024u>::_details::_thread_exit_callback);
  if (bVar2) {
    this = std::
           unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
           ::operator->((unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
                         *)&BASE<tls_data_t,1024u>::_details::_thread_exit_callback);
    pvVar3 = std::array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL>::operator[]
                       ((array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL> *)
                        (BASE<tls_data_t,1024u>::_d + 0x40),(ulong)lock._M_device._4_4_);
    std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>::operator()(this,pvVar3);
  }
  pvVar3 = std::array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL>::operator[]
                     ((array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL> *)
                      (BASE<tls_data_t,1024u>::_d + 0x40),(ulong)lock._M_device._4_4_);
  vVar1 = lock._M_device._4_4_;
  pvVar3->_index = 0xffffffff;
  __n = (ulong)(uint)BASE<tls_data_t,1024u>::_d._28736_4_;
  BASE<tls_data_t,1024u>::_d._28736_4_ = BASE<tls_data_t,1024u>::_d._28736_4_ + 1;
  pvVar4 = std::array<unsigned_int,_1024UL>::operator[]
                     ((array<unsigned_int,_1024UL> *)(BASE<tls_data_t,1024u>::_d + 0x6040),__n);
  *pvVar4 = vVar1;
  std::lock_guard<TLS::BASE<tls_data_t,_1024U>::_details>::~lock_guard(&local_20);
  return;
}

Assistant:

static void thread_exiting(void * value)
#endif
			{
#ifndef _MSC_VER
				pthread_setspecific(_pthread_key, NULL);
#endif
				uint32_t index = (uint32_t)(uintptr_t)value;
				TLS_ASSERT_(index < MAX_THREADS);
				{
					std::lock_guard<_details> lock(_d);
					TLS_ASSERT_(_d._data[index]._index == index);
					if (_thread_exit_callback)
						_thread_exit_callback->operator()(_d._data[index]);
					_d._data[index]._index = UNUSED_INDEX;
					_d._available_ids[_d._available_id_index++] = index;
					TLS_ASSERT_(_d._available_id_index <= MAX_THREADS);
				}
			}